

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oss.cpp
# Opt level: O1

int __thiscall anon_unknown.dwarf_273a44::OSSPlayback::mixerProc(OSSPlayback *this)

{
  uint uVar1;
  ALCdevice *pAVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ssize_t sVar8;
  uint *puVar9;
  char *pcVar10;
  pointer outBuffer;
  size_t __n;
  pollfd pollitem;
  pollfd local_40;
  ulong local_38;
  
  SetRTPriority();
  althrd_setname("alsoft-mixer");
  pAVar2 = (this->super_BackendBase).mDevice;
  uVar4 = ChannelsFromDevFmt(pAVar2->FmtChans,pAVar2->mAmbiOrder);
  pAVar2 = (this->super_BackendBase).mDevice;
  uVar5 = BytesFromDevFmt(pAVar2->FmtType);
  uVar6 = ChannelsFromDevFmt(pAVar2->FmtChans,pAVar2->mAmbiOrder);
  if (((this->mKillNow)._M_base._M_i & 1U) == 0) {
    local_38 = (ulong)uVar4;
    do {
      if (((((this->super_BackendBase).mDevice)->Connected)._M_base._M_i & 1U) == 0) {
        return 0;
      }
      local_40.events = 4;
      local_40.fd = this->mFd;
      local_40.revents = 0;
      iVar7 = poll(&local_40,1,1000);
      if (iVar7 < 0) {
        puVar9 = (uint *)__errno_location();
        uVar1 = *puVar9;
        if ((uVar1 != 4) && (uVar1 != 0xb)) {
          if (0 < (int)gLogLevel) {
            _GLOBAL__N_1::OSSPlayback::mixerProc((OSSPlayback *)(ulong)uVar1);
          }
          pAVar2 = (this->super_BackendBase).mDevice;
          pcVar10 = strerror(*puVar9);
          ALCdevice::handleDisconnect(pAVar2,"Failed waiting for playback buffer: %s",pcVar10);
          return 0;
        }
      }
      else if (iVar7 == 0) {
        if (1 < (int)gLogLevel) {
          _GLOBAL__N_1::OSSPlayback::mixerProc();
        }
      }
      else {
        outBuffer = (this->mMixData).
                    super__Vector_base<unsigned_char,_al::allocator<unsigned_char,_1UL>_>._M_impl.
                    super__Vector_impl_data._M_start;
        __n = (long)(this->mMixData).
                    super__Vector_base<unsigned_char,_al::allocator<unsigned_char,_1UL>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)outBuffer;
        ALCdevice::renderSamples
                  ((this->super_BackendBase).mDevice,outBuffer,(ALuint)(__n / (uVar6 * uVar5)),
                   local_38);
        do {
          if ((__n == 0) || (((this->mKillNow)._M_base._M_i & 1U) != 0)) break;
          sVar8 = write(this->mFd,outBuffer,__n);
          if (sVar8 < 0) {
            puVar9 = (uint *)__errno_location();
            uVar1 = *puVar9;
            bVar3 = false;
            if ((uVar1 != 4) && (uVar1 != 0xb)) {
              if (0 < (int)gLogLevel) {
                _GLOBAL__N_1::OSSPlayback::mixerProc((OSSPlayback *)(ulong)uVar1);
              }
              pAVar2 = (this->super_BackendBase).mDevice;
              pcVar10 = strerror(*puVar9);
              ALCdevice::handleDisconnect(pAVar2,"Failed writing playback samples: %s",pcVar10);
              bVar3 = true;
            }
          }
          else {
            __n = __n - sVar8;
            outBuffer = outBuffer + sVar8;
            bVar3 = false;
          }
        } while (!bVar3);
      }
    } while (((this->mKillNow)._M_base._M_i & 1U) == 0);
  }
  return 0;
}

Assistant:

int OSSPlayback::mixerProc()
{
    SetRTPriority();
    althrd_setname(MIXER_THREAD_NAME);

    const size_t frame_step{mDevice->channelsFromFmt()};
    const ALuint frame_size{mDevice->frameSizeFromFmt()};

    while(!mKillNow.load(std::memory_order_acquire) &&
          mDevice->Connected.load(std::memory_order_acquire))
    {
        pollfd pollitem{};
        pollitem.fd = mFd;
        pollitem.events = POLLOUT;

        int pret{poll(&pollitem, 1, 1000)};
        if(pret < 0)
        {
            if(errno == EINTR || errno == EAGAIN)
                continue;
            ERR("poll failed: %s\n", strerror(errno));
            mDevice->handleDisconnect("Failed waiting for playback buffer: %s", strerror(errno));
            break;
        }
        else if(pret == 0)
        {
            WARN("poll timeout\n");
            continue;
        }

        ALubyte *write_ptr{mMixData.data()};
        size_t to_write{mMixData.size()};
        mDevice->renderSamples(write_ptr, static_cast<ALuint>(to_write/frame_size), frame_step);
        while(to_write > 0 && !mKillNow.load(std::memory_order_acquire))
        {
            ssize_t wrote{write(mFd, write_ptr, to_write)};
            if(wrote < 0)
            {
                if(errno == EAGAIN || errno == EWOULDBLOCK || errno == EINTR)
                    continue;
                ERR("write failed: %s\n", strerror(errno));
                mDevice->handleDisconnect("Failed writing playback samples: %s", strerror(errno));
                break;
            }

            to_write -= static_cast<size_t>(wrote);
            write_ptr += wrote;
        }
    }

    return 0;
}